

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

int SUNMatScaleAdd_Band(realtype c,SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  realtype *B_colj;
  realtype *A_colj;
  sunindextype j;
  sunindextype i;
  SUNMatrix B_local;
  SUNMatrix A_local;
  realtype c_local;
  
  iVar3 = SMCompatible_Band(A,B);
  if (iVar3 == 0) {
    c_local._4_4_ = 1;
  }
  else if ((*(long *)((long)A->content + 0x18) < *(long *)((long)B->content + 0x18)) ||
          (*(long *)((long)A->content + 0x20) < *(long *)((long)B->content + 0x20))) {
    c_local._4_4_ = SMScaleAddNew_Band(c,A,B);
  }
  else {
    for (A_colj = (realtype *)0x0; (long)A_colj < *(long *)((long)A->content + 8);
        A_colj = (realtype *)((long)A_colj + 1)) {
      lVar4 = *(long *)(*(long *)((long)A->content + 0x40) + (long)A_colj * 8) +
              *(long *)((long)A->content + 0x28) * 8;
      lVar1 = *(long *)(*(long *)((long)B->content + 0x40) + (long)A_colj * 8);
      lVar2 = *(long *)((long)B->content + 0x28);
      for (j = -*(long *)((long)B->content + 0x18); j <= *(long *)((long)B->content + 0x20);
          j = j + 1) {
        *(double *)(lVar4 + j * 8) =
             c * *(double *)(lVar4 + j * 8) + *(double *)(lVar1 + lVar2 * 8 + j * 8);
      }
    }
    c_local._4_4_ = 0;
  }
  return c_local._4_4_;
}

Assistant:

int SUNMatScaleAdd_Band(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j;
  realtype *A_colj, *B_colj;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Band(A, B))
    return 1;

  /* Call separate routine in B has larger bandwidth(s) than A */
  if ( (SM_UBAND_B(B) > SM_UBAND_B(A)) ||
       (SM_LBAND_B(B) > SM_LBAND_B(A)) ) {
    return SMScaleAddNew_Band(c,A,B);
  }
  
  /* Otherwise, perform operation in-place */
  for (j=0; j<SM_COLUMNS_B(A); j++) {
    A_colj = SM_COLUMN_B(A,j);
    B_colj = SM_COLUMN_B(B,j);
    for (i=-SM_UBAND_B(B); i<=SM_LBAND_B(B); i++)
      A_colj[i] = c*A_colj[i] + B_colj[i];
  }
  return 0;
}